

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_OffsetSurfaceValue>::Append
          (ON_SimpleArray<ON_OffsetSurfaceValue> *this,ON_OffsetSurfaceValue *x)

{
  int iVar1;
  ON_OffsetSurfaceValue *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  ON_OffsetSurfaceValue *memblock;
  int iVar7;
  uint uVar8;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if ((iVar1 < 8) || ((ulong)((long)iVar1 * 0x28) < 0x10000001)) {
      uVar8 = 4;
      if (2 < iVar1) {
        uVar8 = iVar1 * 2;
      }
    }
    else {
      iVar7 = 0x66666e;
      if (iVar1 < 0x66666e) {
        iVar7 = iVar1;
      }
      uVar8 = iVar7 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_OffsetSurfaceValue *)onmalloc(0x28);
      dVar3 = x->m_t;
      dVar4 = x->m_distance;
      dVar5 = x->m_radius;
      memblock->m_s = x->m_s;
      memblock->m_t = dVar3;
      memblock->m_distance = dVar4;
      memblock->m_radius = dVar5;
      uVar6 = *(undefined4 *)&x->field_0x24;
      memblock->m_index = x->m_index;
      *(undefined4 *)&memblock->field_0x24 = uVar6;
    }
    if ((uint)this->m_capacity < uVar8) {
      SetCapacity(this,(long)(int)uVar8);
    }
    if (this->m_a == (ON_OffsetSurfaceValue *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar2 = this->m_a;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  pOVar2[iVar1].m_index = memblock->m_index;
  dVar3 = memblock->m_s;
  dVar4 = memblock->m_t;
  dVar5 = memblock->m_radius;
  pOVar2[iVar1].m_distance = memblock->m_distance;
  (&pOVar2[iVar1].m_distance)[1] = dVar5;
  pOVar2[iVar1].m_s = dVar3;
  pOVar2[iVar1].m_t = dVar4;
  if (memblock != x) {
    onfree(memblock);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}